

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O1

int __thiscall QAbstractAnimation::totalDuration(QAbstractAnimation *this)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = (**(code **)(*(long *)this + 0x60))();
  iVar4 = iVar3;
  if (0 < iVar3) {
    lVar2 = *(long *)(this + 8);
    if ((*(long **)(lVar2 + 0x48) != (long *)0x0) && (**(long **)(lVar2 + 0x48) != 0)) {
      QBindingStorage::registerDependency_helper
                ((QBindingStorage *)(lVar2 + 0x40),(QUntypedPropertyData *)(lVar2 + 0x88));
    }
    iVar1 = *(int *)(lVar2 + 0x88);
    iVar4 = -1;
    if (-1 < iVar1) {
      iVar4 = iVar3 * iVar1;
    }
  }
  return iVar4;
}

Assistant:

int QAbstractAnimation::totalDuration() const
{
    int dura = duration();
    if (dura <= 0)
        return dura;
    int loopcount = loopCount();
    if (loopcount < 0)
        return -1;
    return dura * loopcount;
}